

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_decoder.c
# Opt level: O0

lzma_ret lzma_lz_decoder_init
                   (lzma_next_coder *next,lzma_allocator *allocator,lzma_filter_info *filters,
                   _func_lzma_ret_lzma_lz_decoder_ptr_lzma_allocator_ptr_void_ptr_lzma_lz_options_ptr
                   *lz_init)

{
  code *pcVar1;
  void *pvVar2;
  uint8_t *local_f0;
  size_t offset;
  size_t copy_size;
  uint8_t *puStack_c0;
  lzma_ret ret_;
  lzma_lz_options lz_options;
  undefined1 local_60 [40];
  _func_void_ptr_void_ptr_size_t_size_t *local_38;
  lzma_coder *coder;
  _func_lzma_ret_lzma_lz_decoder_ptr_lzma_allocator_ptr_void_ptr_lzma_lz_options_ptr *lz_init_local;
  lzma_filter_info *filters_local;
  lzma_allocator *allocator_local;
  lzma_next_coder *next_local;
  
  local_38 = (_func_void_ptr_void_ptr_size_t_size_t *)next->coder;
  coder = (lzma_coder *)lz_init;
  lz_init_local =
       (_func_lzma_ret_lzma_lz_decoder_ptr_lzma_allocator_ptr_void_ptr_lzma_lz_options_ptr *)filters
  ;
  filters_local = (lzma_filter_info *)allocator;
  allocator_local = (lzma_allocator *)next;
  if (local_38 == (_func_void_ptr_void_ptr_size_t_size_t *)0x0) {
    local_38 = (_func_void_ptr_void_ptr_size_t_size_t *)lzma_alloc(0x10b8,allocator);
    if (local_38 == (_func_void_ptr_void_ptr_size_t_size_t *)0x0) {
      return LZMA_MEM_ERROR;
    }
    allocator_local->alloc = local_38;
    allocator_local[1].alloc = lz_decode;
    allocator_local[1].free = lz_decoder_end;
    *(long *)local_38 = 0;
    *(long *)(local_38 + 0x20) = 0;
    pcVar1 = local_38 + 0x30;
    memset(local_60,0,0x28);
    memcpy(pcVar1,local_60,0x28);
    pcVar1 = local_38 + 0x58;
    memset(&lz_options.preset_dict_size,0,0x48);
    memcpy(pcVar1,&lz_options.preset_dict_size,0x48);
  }
  next_local._4_4_ =
       (*(code *)coder)(local_38 + 0x30,filters_local,*(undefined8 *)(lz_init_local + 0x10),
                        &stack0xffffffffffffff40);
  if (next_local._4_4_ == LZMA_OK) {
    if (puStack_c0 < 0x1000) {
      puStack_c0 = (uint8_t *)0x1000;
    }
    if (puStack_c0 < 0xfffffffffffffff1) {
      puStack_c0 = (uint8_t *)((long)puStack_c0 + 0xfU & 0xfffffffffffffff0);
      if (*(uint8_t **)(local_38 + 0x20) != puStack_c0) {
        lzma_free(*(void **)local_38,(lzma_allocator *)filters_local);
        pvVar2 = lzma_alloc((size_t)puStack_c0,(lzma_allocator *)filters_local);
        *(void **)local_38 = pvVar2;
        if (*(long *)local_38 == 0) {
          return LZMA_MEM_ERROR;
        }
        *(uint8_t **)(local_38 + 0x20) = puStack_c0;
      }
      lz_decoder_reset((lzma_coder *)allocator_local->alloc);
      if ((lz_options.dict_size != 0) && (lz_options.preset_dict != (uint8_t *)0x0)) {
        if (lz_options.preset_dict < puStack_c0) {
          local_f0 = lz_options.preset_dict;
        }
        else {
          local_f0 = puStack_c0;
        }
        memcpy(*(void **)local_38,lz_options.preset_dict + (lz_options.dict_size - (long)local_f0),
               (size_t)local_f0);
        *(uint8_t **)(local_38 + 8) = local_f0;
        *(uint8_t **)(local_38 + 0x10) = local_f0;
      }
      local_38[0xa0] = (code)0x0;
      local_38[0xa1] = (code)0x0;
      *(long *)(local_38 + 0xa8) = 0;
      *(long *)(local_38 + 0xb0) = 0;
      next_local._4_4_ =
           lzma_next_filter_init
                     ((lzma_next_coder *)(local_38 + 0x58),(lzma_allocator *)filters_local,
                      (lzma_filter_info *)(lz_init_local + 0x18));
    }
    else {
      next_local._4_4_ = LZMA_MEM_ERROR;
    }
  }
  return next_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_lz_decoder_init(lzma_next_coder *next, const lzma_allocator *allocator,
		const lzma_filter_info *filters,
		lzma_ret (*lz_init)(lzma_lz_decoder *lz,
			const lzma_allocator *allocator, const void *options,
			lzma_lz_options *lz_options))
{
	// Allocate the base structure if it isn't already allocated.
	lzma_coder *coder = next->coder;
	if (coder == NULL) {
		coder = lzma_alloc(sizeof(lzma_coder), allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		next->coder = coder;
		next->code = &lz_decode;
		next->end = &lz_decoder_end;

		coder->dict.buf = NULL;
		coder->dict.size = 0;
		coder->lz = LZMA_LZ_DECODER_INIT;
		coder->next = LZMA_NEXT_CODER_INIT;
	}

	// Allocate and initialize the LZ-based decoder. It will also give
	// us the dictionary size.
	lzma_lz_options lz_options;
	return_if_error(lz_init(&coder->lz, allocator,
			filters[0].options, &lz_options));

	// If the dictionary size is very small, increase it to 4096 bytes.
	// This is to prevent constant wrapping of the dictionary, which
	// would slow things down. The downside is that since we don't check
	// separately for the real dictionary size, we may happily accept
	// corrupt files.
	if (lz_options.dict_size < 4096)
		lz_options.dict_size = 4096;

	// Make dictionary size a multipe of 16. Some LZ-based decoders like
	// LZMA use the lowest bits lzma_dict.pos to know the alignment of the
	// data. Aligned buffer is also good when memcpying from the
	// dictionary to the output buffer, since applications are
	// recommended to give aligned buffers to liblzma.
	//
	// Avoid integer overflow.
	if (lz_options.dict_size > SIZE_MAX - 15)
		return LZMA_MEM_ERROR;

	lz_options.dict_size = (lz_options.dict_size + 15) & ~((size_t)(15));

	// Allocate and initialize the dictionary.
	if (coder->dict.size != lz_options.dict_size) {
		lzma_free(coder->dict.buf, allocator);
		coder->dict.buf
				= lzma_alloc(lz_options.dict_size, allocator);
		if (coder->dict.buf == NULL)
			return LZMA_MEM_ERROR;

		coder->dict.size = lz_options.dict_size;
	}

	lz_decoder_reset(next->coder);

	// Use the preset dictionary if it was given to us.
	if (lz_options.preset_dict != NULL
			&& lz_options.preset_dict_size > 0) {
		// If the preset dictionary is bigger than the actual
		// dictionary, copy only the tail.
		const size_t copy_size = my_min(lz_options.preset_dict_size,
				lz_options.dict_size);
		const size_t offset = lz_options.preset_dict_size - copy_size;
		memcpy(coder->dict.buf, lz_options.preset_dict + offset,
				copy_size);
		coder->dict.pos = copy_size;
		coder->dict.full = copy_size;
	}

	// Miscellaneous initializations
	coder->next_finished = false;
	coder->this_finished = false;
	coder->temp.pos = 0;
	coder->temp.size = 0;

	// Initialize the next filter in the chain, if any.
	return lzma_next_filter_init(&coder->next, allocator, filters + 1);
}